

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

_Bool use_http_1_1plus(Curl_easy *data,connectdata *conn)

{
  bool local_21;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  if (((data->state).httpversion == 10) || (conn->httpversion == 10)) {
    data_local._7_1_ = false;
  }
  else if (((data->set).httpversion == 1) && (conn->httpversion < 0xb)) {
    data_local._7_1_ = false;
  }
  else {
    local_21 = true;
    if ((data->set).httpversion != 0) {
      local_21 = 1 < (data->set).httpversion;
    }
    data_local._7_1_ = local_21;
  }
  return data_local._7_1_;
}

Assistant:

static bool use_http_1_1plus(const struct Curl_easy *data,
                             const struct connectdata *conn)
{
  if((data->state.httpversion == 10) || (conn->httpversion == 10))
    return FALSE;
  if((data->set.httpversion == CURL_HTTP_VERSION_1_0) &&
     (conn->httpversion <= 10))
    return FALSE;
  return ((data->set.httpversion == CURL_HTTP_VERSION_NONE) ||
          (data->set.httpversion >= CURL_HTTP_VERSION_1_1));
}